

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::mouseReleaseEvent(QToolButton *this,QMouseEvent *e)

{
  byte *pbVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QAbstractButton>::QPointer<void>
            ((QPointer<QAbstractButton> *)&local_38,&this->super_QAbstractButton);
  QAbstractButton::mouseReleaseEvent(&this->super_QAbstractButton,e);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
  if (bVar3) {
    pbVar1 = (byte *)(lVar2 + 0x2ec);
    *pbVar1 = *pbVar1 & 0xfc;
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QToolButton);
    QPointer<QAbstractButton> guard(this);
    QAbstractButton::mouseReleaseEvent(e);
    if (guard)
        d->buttonPressed = QToolButtonPrivate::NoButtonPressed;
}